

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Abc_ObjToGia2(Gia_Man_t *pNew,Abc_Ntk_t *p,Abc_Obj_t *pObj,Vec_Int_t *vTemp,int fUseXors)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                  ,0x364,
                  "int Abc_ObjToGia2(Gia_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, Vec_Int_t *, int)");
  }
  vTemp->nSize = 0;
  iVar1 = (pObj->vFanins).nSize;
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      iVar1 = *(int *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]] + 0x40);
      if (iVar1 < 0) {
        __assert_fail("pFanin->iTemp >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                      ,0x368,
                      "int Abc_ObjToGia2(Gia_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, Vec_Int_t *, int)");
      }
      Vec_IntPush(vTemp,iVar1);
      lVar3 = lVar3 + 1;
      iVar1 = (pObj->vFanins).nSize;
    } while (lVar3 < iVar1);
  }
  if (iVar1 == 2) {
    if ((0 < vTemp->nSize) && (vTemp->nSize != 1)) {
      uVar2 = Gia_ManAppendAnd2(pNew,*vTemp->pArray,vTemp->pArray[1]);
LAB_003b054b:
      if (-1 < (int)uVar2) {
        return uVar2 ^ 1;
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 == 0) {
        iVar1 = Abc_SopIsConst0((char *)(pObj->field_5).pData);
        return (uint)(iVar1 == 0);
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                    ,0x371,
                    "int Abc_ObjToGia2(Gia_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, Vec_Int_t *, int)");
    }
    iVar1 = Abc_SopIsBuf((char *)(pObj->field_5).pData);
    if (iVar1 == 0) {
      if (0 < vTemp->nSize) {
        uVar2 = *vTemp->pArray;
        goto LAB_003b054b;
      }
    }
    else if (0 < vTemp->nSize) {
      return *vTemp->pArray;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_ObjToGia2( Gia_Man_t * pNew, Abc_Ntk_t * p, Abc_Obj_t * pObj, Vec_Int_t * vTemp, int fUseXors )
{
    Abc_Obj_t * pFanin; int k;
    assert( Abc_ObjIsNode(pObj) );
    Vec_IntClear( vTemp );
    Abc_ObjForEachFanin( pObj, pFanin, k )
    {
        assert( pFanin->iTemp >= 0 );
        Vec_IntPush( vTemp, pFanin->iTemp );
    }
    if ( Abc_ObjFaninNum(pObj) == 0 )
        return Abc_SopIsConst0( (char*)pObj->pData ) ? 0 : 1;
    if ( Abc_ObjFaninNum(pObj) == 1 )
        return Abc_SopIsBuf( (char*)pObj->pData ) ? Vec_IntEntry(vTemp, 0) : Abc_LitNot(Vec_IntEntry(vTemp, 0));
    if ( Abc_ObjFaninNum(pObj) == 2 ) // nand2
        return Abc_LitNot( Gia_ManAppendAnd2( pNew, Vec_IntEntry(vTemp, 0), Vec_IntEntry(vTemp, 1) ) );
    assert( 0 );
    return -1;
}